

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O3

void __thiscall
IRBuilderAsmJs::EnsureLoopBodyAsmJsLoadSlot(IRBuilderAsmJs *this,RegSlot regSlot,IRType type)

{
  BVFixed *this_00;
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  BVIndex BVar4;
  JitLoopBodyData *pJVar5;
  undefined4 *puVar6;
  SymOpnd *src1Opnd;
  StackSym *sym;
  RegOpnd *dstOpnd;
  Instr *instr;
  
  pJVar5 = GetJitLoopBodyData(this);
  this_00 = pJVar5->m_ldSlots;
  BVar4 = BVFixed::Length(this_00);
  if (BVar4 <= regSlot) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0xdf7,"(regSlot < ldSlotsBV->Length())","regSlot < ldSlotsBV->Length()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  BVar3 = BVFixed::TestAndSet(this_00,regSlot);
  if (BVar3 == '\0') {
    src1Opnd = BuildAsmJsLoopBodySlotOpnd(this,regSlot,type);
    sym = StackSym::FindOrCreate(regSlot,regSlot,this->m_func,(src1Opnd->super_Opnd).m_type);
    dstOpnd = IR::RegOpnd::New(sym,sym->m_type,this->m_func);
    instr = IR::Instr::New(LdSlot,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
    IR::Instr::InsertAfter(this->m_func->m_headInstr,instr);
    if (this->m_lastInstr == this->m_func->m_headInstr) {
      this->m_lastInstr = instr;
    }
  }
  return;
}

Assistant:

void
IRBuilderAsmJs::EnsureLoopBodyAsmJsLoadSlot(Js::RegSlot regSlot, IRType type)
{
    BVFixed* ldSlotsBV = GetJitLoopBodyData().GetLdSlots();

    AssertOrFailFast(regSlot < ldSlotsBV->Length());
    if (ldSlotsBV->TestAndSet(regSlot))
    {
        return;
    }

    IR::SymOpnd * fieldSymOpnd = this->BuildAsmJsLoopBodySlotOpnd(regSlot, type);

    StackSym * symDst = StackSym::FindOrCreate(static_cast<SymID>(regSlot), regSlot, m_func, fieldSymOpnd->GetType());
    IR::RegOpnd * dstOpnd = IR::RegOpnd::New(symDst, symDst->GetType(), m_func);
    IR::Instr * ldSlotInstr = IR::Instr::New(Js::OpCode::LdSlot, dstOpnd, fieldSymOpnd, m_func);

    m_func->m_headInstr->InsertAfter(ldSlotInstr);
    if (m_lastInstr == m_func->m_headInstr)
    {
        m_lastInstr = ldSlotInstr;
    }
}